

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

size_t decay_npurge_after_interval(arena_decay_t *decay,size_t interval)

{
  uint64_t sum;
  size_t i;
  size_t interval_local;
  arena_decay_t *decay_local;
  
  sum = 0;
  for (i = 0; i < interval; i = i + 1) {
    sum = decay->backlog[i] * h_steps[i] + sum;
  }
  for (; i < 200; i = i + 1) {
    sum = decay->backlog[i] * (h_steps[i] - h_steps[i - interval]) + sum;
  }
  return sum >> 0x18;
}

Assistant:

static inline size_t
decay_npurge_after_interval(arena_decay_t *decay, size_t interval) {
	size_t i;
	uint64_t sum = 0;
	for (i = 0; i < interval; i++) {
		sum += decay->backlog[i] * h_steps[i];
	}
	for (; i < SMOOTHSTEP_NSTEPS; i++) {
		sum += decay->backlog[i] * (h_steps[i] - h_steps[i - interval]);
	}

	return (size_t)(sum >> SMOOTHSTEP_BFP);
}